

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFTokenizer.cc
# Opt level: O3

void __thiscall qpdf::Tokenizer::inHexstring(Tokenizer *this,char ch)

{
  byte bVar1;
  state_e sVar2;
  uint uVar3;
  long *plVar4;
  long *plVar5;
  long *local_88;
  long local_80;
  long local_78;
  long lStack_70;
  long *local_68;
  ulong local_60;
  long local_58 [2];
  long *local_48;
  long local_40;
  long local_38;
  long lStack_30;
  
  bVar1 = ch - 0x30;
  if (bVar1 < 10) {
LAB_001e2a3f:
    this->char_code = (uint)(byte)(bVar1 << 4);
    sVar2 = st_in_hexstring_2nd;
  }
  else {
    if (ch < 'a') {
      if ('@' < ch) {
        bVar1 = ch - 0x37;
        goto LAB_001e2a3b;
      }
      uVar3 = (uint)ch;
      if (0x3e < uVar3) goto LAB_001e2a84;
      if ((0x100003e01U >> ((ulong)uVar3 & 0x3f) & 1) != 0) {
        return;
      }
      if ((ulong)uVar3 != 0x3e) goto LAB_001e2a84;
      this->type = tt_string;
    }
    else {
      bVar1 = ch + 0xa9;
LAB_001e2a3b:
      if (bVar1 < 0x10) goto LAB_001e2a3f;
LAB_001e2a84:
      this->type = tt_bad;
      local_68 = local_58;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"invalid character (","");
      plVar4 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_68,local_60,0,'\x01');
      plVar5 = plVar4 + 2;
      if ((long *)*plVar4 == plVar5) {
        local_78 = *plVar5;
        lStack_70 = plVar4[3];
        local_88 = &local_78;
      }
      else {
        local_78 = *plVar5;
        local_88 = (long *)*plVar4;
      }
      local_80 = plVar4[1];
      *plVar4 = (long)plVar5;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_88);
      plVar5 = plVar4 + 2;
      if ((long *)*plVar4 == plVar5) {
        local_38 = *plVar5;
        lStack_30 = plVar4[3];
        local_48 = &local_38;
      }
      else {
        local_38 = *plVar5;
        local_48 = (long *)*plVar4;
      }
      local_40 = plVar4[1];
      *plVar4 = (long)plVar5;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::__cxx11::string::operator=((string *)&this->error_message,(string *)&local_48);
      if (local_48 != &local_38) {
        operator_delete(local_48,local_38 + 1);
      }
      if (local_88 != &local_78) {
        operator_delete(local_88,local_78 + 1);
      }
      if (local_68 != local_58) {
        operator_delete(local_68,local_58[0] + 1);
      }
    }
    sVar2 = st_token_ready;
  }
  this->state = sVar2;
  return;
}

Assistant:

void
Tokenizer::inHexstring(char ch)
{
    if (char hval = util::hex_decode_char(ch); hval < '\20') {
        char_code = int(hval) << 4;
        state = st_in_hexstring_2nd;

    } else if (ch == '>') {
        type = tt::tt_string;
        state = st_token_ready;

    } else if (isSpace(ch)) {
        // ignore

    } else {
        type = tt::tt_bad;
        QTC::TC("qpdf", "QPDFTokenizer bad hexstring character");
        error_message = std::string("invalid character (") + ch + ") in hexstring";
        state = st_token_ready;
    }
}